

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O1

void __thiscall djb::tab_r::tab_r(tab_r *this,brdf *fr,int resolution)

{
  impl *piVar1;
  
  (this->super_radial).super_microfacet.super_brdf._vptr_brdf = (_func_int **)&PTR_eval_001ffcf0;
  piVar1 = (impl *)operator_new(8);
  piVar1->_vptr_impl = (_func_int **)&PTR_clone_00209af0;
  (this->super_radial).super_microfacet.m_fresnel.m_f = piVar1;
  (this->super_radial).super_microfacet.super_brdf._vptr_brdf = (_func_int **)&PTR_eval_001ffd70;
  (this->m_cdf).super__Vector_base<djb::vec2,_std::allocator<djb::vec2>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_cdf).super__Vector_base<djb::vec2,_std::allocator<djb::vec2>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_ndf).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->m_cdf).super__Vector_base<djb::vec2,_std::allocator<djb::vec2>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_ndf).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->m_ndf).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  std::vector<float,_std::allocator<float>_>::reserve(&this->m_ndf,(long)resolution);
  extract_ndf(this,fr,resolution);
  configure(this);
  return;
}

Assistant:

tab_r::tab_r(const brdf &fr, int resolution):
	radial(fresnel::ideal<1>())
{
	m_ndf.reserve(resolution);
	extract_ndf(fr, resolution);
	configure();
}